

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O3

void Acb_ObjToGiaDual(Gia_Man_t *pNew,Acb_Ntk_t *p,int iObj,Vec_Int_t *vTemp,Vec_Int_t *vCopies,
                     int *pRes)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  long lVar8;
  long lVar9;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                  ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
  }
  iVar5 = (p->vObjType).nSize;
  if (iVar5 <= iObj) {
LAB_003acd1b:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  if (0xfd < (byte)((p->vObjType).pArray[(uint)iObj] - 5U)) {
    __assert_fail("!Acb_ObjIsCio(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                  ,0x105,
                  "void Acb_ObjToGiaDual(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, int *)"
                 );
  }
  vTemp->nSize = 0;
  if ((p->vObjFans).nSize <= iObj) goto LAB_003acbce;
  iVar2 = (p->vObjFans).pArray[(uint)iObj];
  lVar8 = (long)iVar2;
  if ((lVar8 < 0) || ((p->vFanSto).nSize <= iVar2)) {
LAB_003accdd:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar3 = (p->vFanSto).pArray;
  if (0 < piVar3[lVar8]) {
    lVar9 = 0;
    do {
      if ((piVar3[lVar8 + lVar9 + 1] < 0) ||
         (uVar6 = piVar3[lVar8 + lVar9 + 1] * 2, vCopies->nSize <= (int)uVar6)) goto LAB_003accdd;
      iVar5 = vCopies->pArray[uVar6];
      if ((iVar5 < 0) || (iVar2 = vCopies->pArray[(ulong)uVar6 + 1], iVar2 < 0)) {
        __assert_fail("pLits[0] >= 0 && pLits[1] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                      ,0x10a,
                      "void Acb_ObjToGiaDual(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, int *)"
                     );
      }
      lVar9 = lVar9 + 1;
      Vec_IntPush(vTemp,iVar5);
      Vec_IntPush(vTemp,iVar2);
    } while (lVar9 < piVar3[lVar8]);
    iVar5 = (p->vObjType).nSize;
  }
  if (iVar5 <= iObj) goto LAB_003acd1b;
  bVar1 = (p->vObjType).pArray[(uint)iObj];
  switch(bVar1) {
  case 7:
    pRes[0] = 0;
    pRes[1] = 0;
    break;
  case 8:
    pRes[0] = 1;
    pRes[1] = 0;
    break;
  case 9:
    pRes[0] = 0;
    pRes[1] = 1;
    break;
  case 10:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_003acaec_caseD_a:
    if (bVar1 - 0xd < 2) {
      Gia_ManDualAndN(pNew,vTemp->pArray,vTemp->nSize / 2,pRes);
      if (bVar1 != 0xe) {
        return;
      }
    }
    else if (bVar1 - 0xf < 2) {
      piVar3 = vTemp->pArray;
      if (vTemp->nSize < 2) {
        iVar5 = vTemp->nSize / 2;
      }
      else {
        lVar8 = 0;
        do {
          if (piVar3[lVar8 * 2] < 0) goto LAB_003acd78;
          piVar3[lVar8 * 2] = piVar3[lVar8 * 2] ^ 1;
          lVar8 = lVar8 + 1;
          iVar5 = vTemp->nSize / 2;
        } while (lVar8 < iVar5);
      }
      Gia_ManDualAndN(pNew,piVar3,iVar5,pRes);
      if (bVar1 != 0xf) {
        return;
      }
    }
    else {
      if (1 < bVar1 - 0x11) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                      ,0x156,
                      "void Acb_ObjToGiaDual(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, int *)"
                     );
      }
      if (vTemp->nSize != 4) {
        __assert_fail("Vec_IntSize(vTemp) == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                      ,0x150,
                      "void Acb_ObjToGiaDual(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, int *)"
                     );
      }
      piVar3 = vTemp->pArray;
      iVar5 = Gia_ManHashXor(pNew,*piVar3,piVar3[2]);
      *pRes = iVar5;
      iVar5 = Gia_ManHashOr(pNew,piVar3[1],piVar3[3]);
      pRes[1] = iVar5;
      if (bVar1 != 0x12) {
        return;
      }
    }
    if (*pRes < 0) {
LAB_003acd78:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
    *pRes = *pRes ^ 1;
    break;
  case 0xb:
    if (vTemp->nSize < 1) {
LAB_003acbce:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    puVar7 = (uint *)vTemp->pArray;
    *pRes = *puVar7;
    if (vTemp->nSize < 2) goto LAB_003acbce;
    goto LAB_003acc0a;
  case 0xc:
    puVar7 = (uint *)vTemp->pArray;
    if ((int)*puVar7 < 0) goto LAB_003acd78;
    *pRes = *puVar7 ^ 1;
LAB_003acc0a:
    uVar6 = puVar7[1];
LAB_003acc0d:
    pRes[1] = uVar6;
    break;
  case 0x15:
    if (vTemp->nSize == 6) {
      piVar3 = vTemp->pArray;
      uVar4 = *(undefined8 *)piVar3;
      *(undefined8 *)piVar3 = *(undefined8 *)(piVar3 + 4);
      *(undefined8 *)(piVar3 + 4) = uVar4;
      Gia_ManDualMux(pNew,piVar3,piVar3 + 2,piVar3 + 4,pRes);
      return;
    }
    __assert_fail("Vec_IntSize(vTemp) == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                  ,0x137,
                  "void Acb_ObjToGiaDual(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, int *)"
                 );
  default:
    if (bVar1 != 0x4e) goto switchD_003acaec_caseD_a;
    if (vTemp->nSize != 4) {
      __assert_fail("Vec_IntSize(vTemp) == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                    ,0x12f,
                    "void Acb_ObjToGiaDual(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, int *)"
                   );
    }
    piVar3 = vTemp->pArray;
    *pRes = *piVar3;
    iVar5 = Gia_ManHashOr(pNew,piVar3[2],piVar3[3]);
    uVar6 = Gia_ManHashOr(pNew,iVar5,piVar3[1]);
    goto LAB_003acc0d;
  }
  return;
}

Assistant:

void Acb_ObjToGiaDual( Gia_Man_t * pNew, Acb_Ntk_t * p, int iObj, Vec_Int_t * vTemp, Vec_Int_t * vCopies, int pRes[2] )
{
    //char * pName = Abc_NamStr( p->pDesign->pStrs, Acb_ObjName(p, iObj) );
    int * pFanin, iFanin, k, Type;
    assert( !Acb_ObjIsCio(p, iObj) );
    Vec_IntClear( vTemp );
    Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, k )
    {
        int * pLits = Vec_IntEntryP( vCopies, 2*iFanin );
        assert( pLits[0] >= 0 && pLits[1] >= 0 );
        Vec_IntPushTwo( vTemp, pLits[0], pLits[1] );
    }
    Type = Acb_ObjType( p, iObj );
    if ( Type == ABC_OPER_CONST_F ) 
    {
        pRes[0] = 0;
        pRes[1] = 0;
        return;
    }
    if ( Type == ABC_OPER_CONST_T ) 
    {
        pRes[0] = 1;
        pRes[1] = 0;
        return;
    }
    if ( Type == ABC_OPER_CONST_X ) 
    {
        pRes[0] = 0;
        pRes[1] = 1;
        return;
    }
    if ( Type == ABC_OPER_BIT_BUF ) 
    {
        pRes[0] = Vec_IntEntry(vTemp, 0);
        pRes[1] = Vec_IntEntry(vTemp, 1);
        return;
    }
    if ( Type == ABC_OPER_BIT_INV ) 
    {
        Gia_ManDualNot( pNew, Vec_IntArray(vTemp), pRes );
        return;
    }
    if ( Type == ABC_OPER_TRI ) 
    {
        // in the file inputs are ordered as follows:  _DC \n6_5[9] ( .O(\108 ), .C(\96 ), .D(\107 ));
        // in this code, we expect them as follows: void Gia_ManDualDc( Gia_Man_t * p, int LitC[2], int LitD[2], int LitZ[2] )
        assert( Vec_IntSize(vTemp) == 4 );
        Gia_ManDualDc( pNew, Vec_IntArray(vTemp), Vec_IntArray(vTemp) + 2, pRes );
        return;
    }
    if ( Type == ABC_OPER_BIT_MUX ) 
    {
        // in the file inputs are ordered as follows:  _HMUX \U$1 ( .O(\282 ), .I0(1'b1), .I1(\277 ), .S(\281 ));
        // in this code, we expect them as follows: void Gia_ManDualMux( Gia_Man_t * p, int LitC[2], int LitT[2], int LitE[2], int LitZ[2] )
        assert( Vec_IntSize(vTemp) == 6 );
        ABC_SWAP( int, Vec_IntArray(vTemp)[0], Vec_IntArray(vTemp)[4] );
        ABC_SWAP( int, Vec_IntArray(vTemp)[1], Vec_IntArray(vTemp)[5] );
        Gia_ManDualMux( pNew, Vec_IntArray(vTemp), Vec_IntArray(vTemp) + 2, Vec_IntArray(vTemp) + 4, pRes );
        return;
    }
    if ( Type == ABC_OPER_BIT_AND || Type == ABC_OPER_BIT_NAND )
    {
        Gia_ManDualAndN( pNew, Vec_IntArray(vTemp), Vec_IntSize(vTemp)/2, pRes );
        if ( Type == ABC_OPER_BIT_NAND )
            pRes[0] = Abc_LitNot( pRes[0] );
        return;
    }
    if ( Type == ABC_OPER_BIT_OR || Type == ABC_OPER_BIT_NOR )
    {
        int * pArray = Vec_IntArray( vTemp );
        for ( k = 0; k < Vec_IntSize(vTemp)/2; k++ )
            pArray[2*k] = Abc_LitNot( pArray[2*k] );
        Gia_ManDualAndN( pNew, pArray, Vec_IntSize(vTemp)/2, pRes );
        if ( Type == ABC_OPER_BIT_OR )
            pRes[0] = Abc_LitNot( pRes[0] );
        return;
    }
    if ( Type == ABC_OPER_BIT_XOR || Type == ABC_OPER_BIT_NXOR )
    {
        assert( Vec_IntSize(vTemp) == 4 );
        Gia_ManDualXor2( pNew, Vec_IntArray(vTemp), Vec_IntArray(vTemp) + 2, pRes );
        if ( Type == ABC_OPER_BIT_NXOR )
            pRes[0] = Abc_LitNot( pRes[0] );
        return;
    }
    assert( 0 );
}